

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
::get_cbor_string(binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                  *this,string_t *result)

{
  bool bVar1;
  char_int_type cVar2;
  char *__s;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t unaff_retaddr;
  int in_stack_0000000c;
  string last_token;
  string_t chunk;
  uint64_t len_3;
  uint32_t len_2;
  uint16_t len_1;
  uint8_t len;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffeb0;
  string_t *in_stack_fffffffffffffeb8;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffec0;
  unsigned_long *in_stack_fffffffffffffec8;
  long *plVar3;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffed0;
  input_format_t format;
  undefined8 uVar4;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee5;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_fffffffffffffef8;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  input_format_t in_stack_ffffffffffffff74;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_ffffffffffffff78;
  string local_78 [32];
  uint local_58;
  string local_48 [16];
  char *in_stack_ffffffffffffffc8;
  input_format_t in_stack_ffffffffffffffd4;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
  *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  undefined7 in_stack_fffffffffffffff8;
  byte in_stack_ffffffffffffffff;
  
  bVar1 = unexpect_eof(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8
                      );
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __s = (char *)(ulong)(*(int *)&in_RDI->field_2 - 0x60);
    format = (input_format_t)((ulong)in_stack_fffffffffffffed0 >> 0x20);
    switch(__s) {
    case (char *)0x0:
    case (char *)0x1:
    case (char *)0x2:
    case (char *)0x3:
    case (char *)0x4:
    case (char *)0x5:
    case (char *)0x6:
    case (char *)0x7:
    case (char *)0x8:
    case (char *)0x9:
    case (char *)0xa:
    case (char *)0xb:
    case (char *)0xc:
    case (char *)0xd:
    case (char *)0xe:
    case (char *)0xf:
    case (char *)0x10:
    case (char *)0x11:
    case (char *)0x12:
    case (char *)0x13:
    case (char *)0x14:
    case (char *)0x15:
    case (char *)0x16:
    case (char *)0x17:
      in_stack_ffffffffffffffff =
           get_string<unsigned_int>
                     (in_stack_fffffffffffffec0,
                      (input_format_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                      (uint)in_stack_fffffffffffffeb8,(string_t *)in_stack_fffffffffffffeb0);
      break;
    case (char *)0x18:
      bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
              ::get_number<unsigned_char,false>
                        (in_stack_fffffffffffffed8,format,(uchar *)in_stack_fffffffffffffec8);
      in_stack_ffffffffffffffff = 0;
      if (bVar1) {
        in_stack_ffffffffffffffff =
             get_string<unsigned_char>
                       (in_stack_fffffffffffffec0,
                        (input_format_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                        (uchar)((ulong)in_stack_fffffffffffffeb8 >> 0x18),
                        (string_t *)in_stack_fffffffffffffeb0);
      }
      break;
    case (char *)0x19:
      bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
              ::get_number<unsigned_short,false>
                        (in_stack_fffffffffffffed8,format,
                         (unsigned_short *)in_stack_fffffffffffffec8);
      in_stack_ffffffffffffffff = 0;
      if (bVar1) {
        in_stack_ffffffffffffffff =
             get_string<unsigned_short>
                       (in_stack_fffffffffffffec0,
                        (input_format_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                        (unsigned_short)((ulong)in_stack_fffffffffffffeb8 >> 0x10),
                        (string_t *)in_stack_fffffffffffffeb0);
      }
      break;
    case (char *)0x1a:
      bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
              ::get_number<unsigned_int,false>
                        (in_stack_fffffffffffffed8,format,(uint *)in_stack_fffffffffffffec8);
      in_stack_ffffffffffffffff = 0;
      if (bVar1) {
        in_stack_ffffffffffffffff =
             get_string<unsigned_int>
                       (in_stack_fffffffffffffec0,
                        (input_format_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                        (uint)in_stack_fffffffffffffeb8,(string_t *)in_stack_fffffffffffffeb0);
      }
      break;
    case (char *)0x1b:
      bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
              ::get_number<unsigned_long,false>
                        (in_stack_fffffffffffffed8,format,in_stack_fffffffffffffec8);
      in_stack_ffffffffffffffff = 0;
      if (bVar1) {
        in_stack_ffffffffffffffff =
             get_string<unsigned_long>
                       (in_stack_fffffffffffffed0,
                        (input_format_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                        (unsigned_long)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      }
      break;
    default:
      get_token_string(in_stack_fffffffffffffef8);
      uVar4 = *(undefined8 *)((long)&in_RDI->field_2 + 8);
      plVar3 = (long *)in_RDI[1]._M_string_length;
      std::operator+((char *)in_stack_fffffffffffffef8,in_RDI);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,__s,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffffee7,
                          CONCAT16(in_stack_fffffffffffffee6,
                                   CONCAT15(in_stack_fffffffffffffee5,
                                            CONCAT14(in_stack_fffffffffffffee4,
                                                     in_stack_fffffffffffffee0)))));
      exception_message(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                        in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      parse_error::create(in_stack_0000000c,unaff_retaddr,
                          (string *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      in_stack_ffffffffffffffff =
           (**(code **)(*plVar3 + 0x60))(plVar3,uVar4,local_78,&stack0xffffffffffffff60);
      in_stack_ffffffffffffffff = in_stack_ffffffffffffffff & 1;
      parse_error::~parse_error((parse_error *)0x116f91);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
      std::__cxx11::string::~string(local_e0);
      local_58 = 1;
      std::__cxx11::string::~string(local_78);
      break;
    case (char *)0x1f:
      do {
        cVar2 = get(in_stack_fffffffffffffeb0);
        if (cVar2 == 0xff) {
          in_stack_ffffffffffffffff = 1;
          break;
        }
        std::__cxx11::string::string(local_48);
        bVar1 = get_cbor_string(in_RSI,(string_t *)
                                       CONCAT17(in_stack_ffffffffffffffe7,
                                                CONCAT16(in_stack_ffffffffffffffe6,
                                                         CONCAT24(in_stack_ffffffffffffffe4,
                                                                  in_stack_ffffffffffffffe0))));
        if (bVar1) {
          std::__cxx11::string::append((string *)in_RSI);
        }
        else {
          in_stack_ffffffffffffffff = 0;
        }
        local_58 = (uint)!bVar1;
        std::__cxx11::string::~string(local_48);
      } while (local_58 == 0);
    }
  }
  else {
    in_stack_ffffffffffffffff = 0;
  }
  return (bool)(in_stack_ffffffffffffffff & 1);
}

Assistant:

bool get_cbor_string(string_t& result)
    {
        if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::cbor, "string")))
        {
            return false;
        }

        switch (current)
        {
            // UTF-8 string (0x00..0x17 bytes follow)
            case 0x60:
            case 0x61:
            case 0x62:
            case 0x63:
            case 0x64:
            case 0x65:
            case 0x66:
            case 0x67:
            case 0x68:
            case 0x69:
            case 0x6A:
            case 0x6B:
            case 0x6C:
            case 0x6D:
            case 0x6E:
            case 0x6F:
            case 0x70:
            case 0x71:
            case 0x72:
            case 0x73:
            case 0x74:
            case 0x75:
            case 0x76:
            case 0x77:
            {
                return get_string(input_format_t::cbor, static_cast<unsigned int>(current) & 0x1Fu, result);
            }

            case 0x78: // UTF-8 string (one-byte uint8_t for n follows)
            {
                std::uint8_t len{};
                return get_number(input_format_t::cbor, len) && get_string(input_format_t::cbor, len, result);
            }

            case 0x79: // UTF-8 string (two-byte uint16_t for n follow)
            {
                std::uint16_t len{};
                return get_number(input_format_t::cbor, len) && get_string(input_format_t::cbor, len, result);
            }

            case 0x7A: // UTF-8 string (four-byte uint32_t for n follow)
            {
                std::uint32_t len{};
                return get_number(input_format_t::cbor, len) && get_string(input_format_t::cbor, len, result);
            }

            case 0x7B: // UTF-8 string (eight-byte uint64_t for n follow)
            {
                std::uint64_t len{};
                return get_number(input_format_t::cbor, len) && get_string(input_format_t::cbor, len, result);
            }

            case 0x7F: // UTF-8 string (indefinite length)
            {
                while (get() != 0xFF)
                {
                    string_t chunk;
                    if (!get_cbor_string(chunk))
                    {
                        return false;
                    }
                    result.append(chunk);
                }
                return true;
            }

            default:
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read, exception_message(input_format_t::cbor, "expected length specification (0x60-0x7B) or indefinite string type (0x7F); last byte: 0x" + last_token, "string")));
            }
        }
    }